

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderPrefix(xmlTextReaderPtr reader)

{
  xmlNsPtr ns;
  xmlNodePtr node;
  xmlTextReaderPtr reader_local;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->node == (xmlNodePtr)0x0)) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    if (reader->curnode == (xmlNodePtr)0x0) {
      ns = (xmlNsPtr)reader->node;
    }
    else {
      ns = (xmlNsPtr)reader->curnode;
    }
    if (ns->type == XML_NAMESPACE_DECL) {
      if (ns->prefix == (xmlChar *)0x0) {
        reader_local = (xmlTextReaderPtr)0x0;
      }
      else {
        reader_local = (xmlTextReaderPtr)readerStrdup(reader,"xmlns");
      }
    }
    else if ((ns->type == XML_ELEMENT_NODE) || (ns->type == XML_ATTRIBUTE_NODE)) {
      if ((ns[1].prefix == (xmlChar *)0x0) || (*(long *)(ns[1].prefix + 0x18) == 0)) {
        reader_local = (xmlTextReaderPtr)0x0;
      }
      else {
        reader_local = (xmlTextReaderPtr)readerStrdup(reader,*(xmlChar **)(ns[1].prefix + 0x18));
      }
    }
    else {
      reader_local = (xmlTextReaderPtr)0x0;
    }
  }
  return (xmlChar *)reader_local;
}

Assistant:

xmlChar *
xmlTextReaderPrefix(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    if ((reader == NULL) || (reader->node == NULL))
	return(NULL);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;
    if (node->type == XML_NAMESPACE_DECL) {
	xmlNsPtr ns = (xmlNsPtr) node;
	if (ns->prefix == NULL)
	    return(NULL);
	return(readerStrdup(reader, BAD_CAST "xmlns"));
    }
    if ((node->type != XML_ELEMENT_NODE) &&
	(node->type != XML_ATTRIBUTE_NODE))
	return(NULL);
    if ((node->ns != NULL) && (node->ns->prefix != NULL))
	return(readerStrdup(reader, node->ns->prefix));
    return(NULL);
}